

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproxystyle.cpp
# Opt level: O0

QIcon __thiscall
QProxyStyle::standardIcon
          (QProxyStyle *this,StandardPixmap standardIcon,QStyleOption *option,QWidget *widget)

{
  QStyle *pQVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  QIconPrivate *in_RDI;
  undefined8 in_R8;
  QProxyStylePrivate *d;
  undefined4 in_stack_ffffffffffffffe8;
  
  d_func((QProxyStyle *)0x409897);
  QProxyStylePrivate::ensureBaseStyle
            ((QProxyStylePrivate *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  pQVar1 = QPointer<QStyle>::operator->((QPointer<QStyle> *)0x4098b7);
  (**(code **)(*(long *)pQVar1 + 0x100))(in_RDI,pQVar1,in_EDX,in_RCX,in_R8);
  return (QIcon)in_RDI;
}

Assistant:

QIcon QProxyStyle::standardIcon(StandardPixmap standardIcon,
                                const QStyleOption *option,
                                const QWidget *widget) const
{
    Q_D (const QProxyStyle);
    d->ensureBaseStyle();
    return d->baseStyle->standardIcon(standardIcon, option, widget);
}